

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001cde00 = 0x2d2d2d2d2d2d2d;
    uRam00000000001cde07._0_1_ = '-';
    uRam00000000001cde07._1_1_ = '-';
    uRam00000000001cde07._2_1_ = '-';
    uRam00000000001cde07._3_1_ = '-';
    uRam00000000001cde07._4_1_ = '-';
    uRam00000000001cde07._5_1_ = '-';
    uRam00000000001cde07._6_1_ = '-';
    uRam00000000001cde07._7_1_ = '-';
    DAT_001cddf0 = '-';
    DAT_001cddf0_1._0_1_ = '-';
    DAT_001cddf0_1._1_1_ = '-';
    DAT_001cddf0_1._2_1_ = '-';
    DAT_001cddf0_1._3_1_ = '-';
    DAT_001cddf0_1._4_1_ = '-';
    DAT_001cddf0_1._5_1_ = '-';
    DAT_001cddf0_1._6_1_ = '-';
    uRam00000000001cddf8 = 0x2d2d2d2d2d2d2d;
    DAT_001cddff = 0x2d;
    DAT_001cdde0 = '-';
    DAT_001cdde0_1._0_1_ = '-';
    DAT_001cdde0_1._1_1_ = '-';
    DAT_001cdde0_1._2_1_ = '-';
    DAT_001cdde0_1._3_1_ = '-';
    DAT_001cdde0_1._4_1_ = '-';
    DAT_001cdde0_1._5_1_ = '-';
    DAT_001cdde0_1._6_1_ = '-';
    uRam00000000001cdde8._0_1_ = '-';
    uRam00000000001cdde8._1_1_ = '-';
    uRam00000000001cdde8._2_1_ = '-';
    uRam00000000001cdde8._3_1_ = '-';
    uRam00000000001cdde8._4_1_ = '-';
    uRam00000000001cdde8._5_1_ = '-';
    uRam00000000001cdde8._6_1_ = '-';
    uRam00000000001cdde8._7_1_ = '-';
    DAT_001cddd0 = '-';
    DAT_001cddd0_1._0_1_ = '-';
    DAT_001cddd0_1._1_1_ = '-';
    DAT_001cddd0_1._2_1_ = '-';
    DAT_001cddd0_1._3_1_ = '-';
    DAT_001cddd0_1._4_1_ = '-';
    DAT_001cddd0_1._5_1_ = '-';
    DAT_001cddd0_1._6_1_ = '-';
    uRam00000000001cddd8._0_1_ = '-';
    uRam00000000001cddd8._1_1_ = '-';
    uRam00000000001cddd8._2_1_ = '-';
    uRam00000000001cddd8._3_1_ = '-';
    uRam00000000001cddd8._4_1_ = '-';
    uRam00000000001cddd8._5_1_ = '-';
    uRam00000000001cddd8._6_1_ = '-';
    uRam00000000001cddd8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001cddc8._0_1_ = '-';
    uRam00000000001cddc8._1_1_ = '-';
    uRam00000000001cddc8._2_1_ = '-';
    uRam00000000001cddc8._3_1_ = '-';
    uRam00000000001cddc8._4_1_ = '-';
    uRam00000000001cddc8._5_1_ = '-';
    uRam00000000001cddc8._6_1_ = '-';
    uRam00000000001cddc8._7_1_ = '-';
    DAT_001cde0f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}